

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

int Amap_LibCreateMux(Amap_Lib_t *p,int iFan0,int iFan1,int iFan2)

{
  uint uVar1;
  Amap_Nod_t *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 uVar9;
  Amap_Nod_t *pAVar10;
  Amap_Nod_t *pNode;
  int iFan2_local;
  int iFan1_local;
  int iFan0_local;
  Amap_Lib_t *p_local;
  
  pAVar10 = Amap_LibCreateObj(p);
  *(uint *)pAVar10 = *(uint *)pAVar10 & 0xffffff | 0x6000000;
  pAVar2 = p->pNodes;
  iVar3 = Abc_Lit2Var(iFan0);
  uVar1 = *(uint *)(pAVar2 + iVar3);
  pAVar2 = p->pNodes;
  iVar3 = Abc_Lit2Var(iFan1);
  uVar4 = *(uint *)(pAVar2 + iVar3);
  pAVar2 = p->pNodes;
  iVar3 = Abc_Lit2Var(iFan2);
  *(uint *)pAVar10 =
       *(uint *)pAVar10 & 0xff00ffff |
       ((uVar1 >> 0x10 & 0xff) + (uVar4 >> 0x10 & 0xff) + (*(uint *)(pAVar2 + iVar3) >> 0x10 & 0xff)
       & 0xff) << 0x10;
  pAVar10->iFan0 = (short)iFan0;
  pAVar10->iFan1 = (short)iFan1;
  pAVar10->iFan2 = (short)iFan2;
  if (p->fVerbose != 0) {
    uVar1 = *(uint *)pAVar10;
    uVar4 = Abc_Lit2Var(iFan0);
    iVar3 = Abc_LitIsCompl(iFan0);
    uVar5 = 0x2b;
    if (iVar3 != 0) {
      uVar5 = 0x2d;
    }
    uVar6 = Abc_Lit2Var(iFan1);
    iVar3 = Abc_LitIsCompl(iFan1);
    uVar7 = 0x2b;
    if (iVar3 != 0) {
      uVar7 = 0x2d;
    }
    iVar3 = Abc_Lit2Var(iFan2);
    iVar8 = Abc_LitIsCompl(iFan2);
    uVar9 = 0x2b;
    if (iVar8 != 0) {
      uVar9 = 0x2d;
    }
    printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c  iFan2 = %5d%c\n",
           (ulong)(uVar1 & 0xffff),0x6d,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,uVar7,iVar3,uVar9);
  }
  Vec_IntPush(p->vRules3,iFan0);
  Vec_IntPush(p->vRules3,iFan1);
  Vec_IntPush(p->vRules3,iFan2);
  Vec_IntPush(p->vRules3,*(uint *)pAVar10 & 0xffff);
  return *(uint *)pAVar10 & 0xffff;
}

Assistant:

int Amap_LibCreateMux( Amap_Lib_t * p, int iFan0, int iFan1, int iFan2 )
{
    Amap_Nod_t * pNode;
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = AMAP_OBJ_MUX;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan2)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
    pNode->iFan2 = iFan2;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c  iFan2 = %5d%c\n", 
pNode->Id, 'm', 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+'), 
Abc_Lit2Var(iFan2), (Abc_LitIsCompl(iFan2)?'-':'+') );

    Vec_IntPush( p->vRules3, iFan0 );
    Vec_IntPush( p->vRules3, iFan1 );
    Vec_IntPush( p->vRules3, iFan2 );
    Vec_IntPush( p->vRules3, pNode->Id );
    return pNode->Id;
}